

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkloader.c
# Opt level: O0

ktx_error_code_e
linearTilingCallback
          (int miplevel,int face,int width,int height,int depth,ktx_uint64_t faceLodSize,
          void *pixels,void *userdata)

{
  size_t in_R9;
  void *in_stack_00000008;
  VkImageSubresource subRes;
  VkSubresourceLayout subResLayout;
  user_cbdata_linear *ud;
  undefined4 local_5c [3];
  long local_50 [5];
  long local_28;
  size_t local_20;
  
  local_28 = subRes._4_8_;
  local_5c[0] = 1;
  local_20 = in_R9;
  (**(code **)(subRes._4_8_ + 0xa8))
            (*(undefined8 *)(subRes._4_8_ + 0xf8),*(undefined8 *)(subRes._4_8_ + 0xf0),local_5c,
             local_50);
  memcpy((void *)(*(long *)(local_28 + 0x100) + local_50[0]),in_stack_00000008,local_20);
  return KTX_SUCCESS;
}

Assistant:

KTX_error_code
linearTilingCallback(int miplevel, int face,
                      int width, int height, int depth,
                      ktx_uint64_t faceLodSize,
                      void* pixels, void* userdata)
{
    user_cbdata_linear* ud = (user_cbdata_linear*)userdata;
    VkSubresourceLayout subResLayout;
#if !defined(_MSC_VER) || _MSC_VER >= 1920
    VkImageSubresource subRes = {
      .aspectMask = VK_IMAGE_ASPECT_COLOR_BIT,
      .mipLevel = miplevel,
      .arrayLayer = face
    };
#else
    VkImageSubresource subRes = {0};
    subRes.aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;
    subRes.mipLevel = miplevel;
    subRes.arrayLayer = face;
#endif

    UNUSED(width);
    UNUSED(height);
    UNUSED(depth);

    // Get sub resources layout. Includes row pitch, size,
    // offsets, etc.
    ud->vkFuncs.vkGetImageSubresourceLayout(ud->device, ud->destImage, &subRes,
                                &subResLayout);
    // Copies all images of the miplevel (for array & 3d) or a single face.
    memcpy(ud->dest + subResLayout.offset, pixels, faceLodSize);
    return KTX_SUCCESS;
}